

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali_variant.c
# Opt level: O2

cali_variant_t cali_variant_unpack(uchar *buf,size_t *inc,_Bool *okptr)

{
  _Bool _Var1;
  uint64_t uVar2;
  anon_union_8_7_33918203_for_value aVar3;
  cali_variant_t cVar4;
  size_t p;
  size_t local_28;
  
  local_28 = 0;
  uVar2 = vldec_u64(buf,&local_28);
  if (((uint)uVar2 & 0xfe) < 10) {
    aVar3.v_uint = vldec_u64(buf + local_28,&local_28);
    if (inc != (size_t *)0x0) {
      *inc = *inc + local_28;
    }
    _Var1 = true;
  }
  else {
    _Var1 = false;
    aVar3.v_uint = 0;
    uVar2 = 0;
  }
  if (okptr != (_Bool *)0x0) {
    *okptr = _Var1;
  }
  cVar4.value.v_uint = aVar3.v_uint;
  cVar4.type_and_size = uVar2;
  return cVar4;
}

Assistant:

cali_variant_t cali_variant_unpack(const unsigned char* buf, size_t* inc, bool* okptr)
{
    cali_variant_t v = { 0, { .v_uint = 0 } };
    size_t         p = 0;

    uint64_t ts = vldec_u64(buf, &p);

    if (_EXTRACT_TYPE(ts) > CALI_MAXTYPE) {
        if (okptr)
            *okptr = false;

        return v;
    }

    v.type_and_size = ts;
    v.value.v_uint  = vldec_u64(buf + p, &p);

    if (inc)
        *inc += p;
    if (okptr)
        *okptr = true;

    return v;
}